

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateInputOutputRankEquality
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,string *layerType,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *blobNameToRank)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  Type *pTVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(layer->input_).super_RepeatedPtrFieldBase,0);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&blobNameToRank->_M_t,pTVar3);
  p_Var1 = &(blobNameToRank->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(layer->output_).super_RepeatedPtrFieldBase,0);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&blobNameToRank->_M_t,pTVar3);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(layer->input_).super_RepeatedPtrFieldBase,0);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(blobNameToRank,pTVar3);
      iVar2 = *pmVar5;
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(layer->output_).super_RepeatedPtrFieldBase,0);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(blobNameToRank,pTVar3);
      if (iVar2 != *pmVar5) {
        err._M_dataplus._M_p = (pointer)&err.field_2;
        err._M_string_length = 0;
        err.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string
                  ((string *)&local_f0,
                   (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&local_d0,"Layer \'",&local_f0);
        std::operator+(&local_b0,&local_d0,"\' of type \'");
        std::operator+(&local_90,&local_b0,layerType);
        std::operator+(&local_50,&local_90,
                       "\' expects equal ranks for its input and output, but they are not equal.");
        std::__cxx11::string::operator=((string *)&err,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        std::__cxx11::string::~string((string *)&err);
        return __return_storage_ptr__;
      }
    }
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputOutputRankEquality(const Specification::NeuralNetworkLayer& layer, std::string layerType,
                                              std::map<std::string, int>& blobNameToRank) {

    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
        blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
        if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.output(0))) {
            std::string err;
            err = "Layer '" + std::string(layer.name()) + "' of type '" + layerType + "' expects equal ranks for its input and output, but they are not equal.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}